

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

ON_2dPoint ON_LiftInverse(ON_2dPoint P,ON_Interval *dom,bool *closed)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ON_2dPoint OVar8;
  double local_50;
  
  local_50 = P.y;
  dVar3 = P.x;
  if ((*closed != false) || (closed[1] == true)) {
    pdVar1 = dom->m_t + 1;
    lVar2 = 0;
    dVar4 = dVar3;
    do {
      dVar3 = dVar4;
      if (closed[lVar2] == true) {
        dVar6 = dVar4;
        if (lVar2 != 0) {
          dVar6 = local_50;
        }
        dVar3 = ((ON_Interval *)(pdVar1 + -1))->m_t[0];
        dVar5 = 0.0;
        if (ABS(dVar3) < 1.23432101234321e+308) {
          dVar5 = 0.0;
          if (ABS(*pdVar1) < 1.23432101234321e+308) {
            dVar5 = *pdVar1 - dVar3;
          }
        }
        dVar5 = floor((dVar6 - dVar3) / dVar5);
        if (1.23432101234321e+308 <= ABS(dVar3)) {
          dVar7 = 0.0;
        }
        else {
          dVar7 = 0.0;
          if (ABS(*pdVar1) < 1.23432101234321e+308) {
            dVar7 = *pdVar1 - dVar3;
          }
        }
        dVar6 = dVar6 - dVar5 * dVar7;
        dVar3 = dVar6;
        if (lVar2 != 0) {
          dVar3 = dVar4;
          local_50 = dVar6;
        }
      }
      lVar2 = lVar2 + 1;
      pdVar1 = pdVar1 + 2;
      dVar4 = dVar3;
    } while (lVar2 == 1);
  }
  OVar8.y = local_50;
  OVar8.x = dVar3;
  return OVar8;
}

Assistant:

ON_2dPoint ON_LiftInverse(ON_2dPoint P, ON_Interval dom[2], bool closed[2])
{
	ON_2dPoint Q = P;
	if (closed[0] || closed[1])
	{
		for (int di = 0; di < 2; di++)
		{
			if (closed[di])
				Q[di] -= floor((Q[di] - dom[di][0]) / dom[di].Length())*dom[di].Length();

		}
	}
	return Q;
}